

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digit_comparison.h
# Opt level: O2

adjusted_mantissa __thiscall
fast_float::negative_digit_comp<float>
          (fast_float *this,bigint *bigmant,adjusted_mantissa am,int32_t exponent)

{
  fast_float *this_00;
  ulong uVar1;
  bigint *pbVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int32_t shift;
  uint uVar7;
  int iVar8;
  fast_float *this_01;
  adjusted_mantissa aVar9;
  anon_class_4_1_ba1d6a41 local_244;
  fast_float *local_240;
  adjusted_mantissa local_238;
  bigint theor_digits;
  
  iVar4 = am.power2;
  iVar5 = (int)am.mantissa;
  if (iVar5 < -0x27) {
    iVar8 = 1 - iVar5;
    bVar3 = 0;
    if (iVar8 < 0x40) {
      bVar3 = (byte)iVar8;
    }
    uVar1 = 0;
    if (iVar8 < 0x40) {
      uVar1 = (ulong)bigmant >> (bVar3 & 0x3f);
    }
    uVar7 = (uint)(0x7fffff < uVar1);
  }
  else {
    uVar1 = 0;
    uVar7 = 0xff;
    if (iVar5 < 0xd7) {
      uVar1 = (ulong)((uint)((ulong)bigmant >> 0x28) & 0x7fffff);
      uVar7 = iVar5 + 0x28;
    }
  }
  uVar6 = (uint)uVar1;
  uVar7 = (uVar7 << 0x17 | uVar6) & 0x7f800000;
  if (uVar7 == 0) {
    uVar1 = (ulong)(uVar6 & 0x7fffff);
    iVar8 = -0x96;
  }
  else {
    uVar1 = (ulong)(uVar6 & 0x7fffff) | 0x800000;
    iVar8 = (uVar7 >> 0x17) - 0x97;
  }
  this_01 = (fast_float *)&theor_digits;
  local_240 = this;
  bigint::bigint((bigint *)this_01,uVar1 * 2 + 1);
  uVar7 = iVar8 - iVar4;
  if (iVar4 != 0) {
    bigint::pow5(&theor_digits,-iVar4);
  }
  this_00 = local_240;
  if ((int)uVar7 < 1) {
    if (-1 < (int)uVar7) goto LAB_002cb3c0;
    uVar7 = -uVar7;
    this_01 = local_240;
  }
  bigint::shl((bigint *)this_01,(ulong)uVar7);
LAB_002cb3c0:
  local_244.ord = bigint::compare((bigint *)this_00,&theor_digits);
  local_238.mantissa = (uint64_t)bigmant;
  local_238.power2 = iVar5;
  if (iVar5 < -0x27) {
    shift = 0x40;
    if (1 - iVar5 < 0x40) {
      shift = 1 - iVar5;
    }
    negative_digit_comp<float>::anon_class_4_1_ba1d6a41::operator()(&local_244,&local_238,shift);
    uVar1 = (ulong)((bigint *)0x7fffff < local_238.mantissa);
  }
  else {
    negative_digit_comp<float>::anon_class_4_1_ba1d6a41::operator()(&local_244,&local_238,0x28);
    pbVar2 = (bigint *)(ulong)((uint)local_238.mantissa & 0x7fffff);
    if (local_238.mantissa >= (bigint *)0x1000000) {
      pbVar2 = (bigint *)0x0;
    }
    uVar6 = (local_238.power2 + 1) - (uint)(local_238.mantissa < (bigint *)0x1000000);
    uVar7 = uVar6;
    if (0xfe < (int)uVar6) {
      uVar7 = 0xff;
    }
    uVar1 = (ulong)uVar7;
    local_238.mantissa = (uint64_t)pbVar2;
    if (0xfe < (int)uVar6) {
      local_238.mantissa = (uint64_t)(bigint *)0x0;
    }
  }
  aVar9._8_8_ = uVar1;
  aVar9.mantissa = local_238.mantissa;
  return aVar9;
}

Assistant:

inline FASTFLOAT_CONSTEXPR20
adjusted_mantissa negative_digit_comp(bigint& bigmant, adjusted_mantissa am, int32_t exponent) noexcept {
  bigint& real_digits = bigmant;
  int32_t real_exp = exponent;

  // get the value of `b`, rounded down, and get a bigint representation of b+h
  adjusted_mantissa am_b = am;
  // gcc7 buf: use a lambda to remove the noexcept qualifier bug with -Wnoexcept-type.
  round<T>(am_b, [](adjusted_mantissa&a, int32_t shift) { round_down(a, shift); });
  T b;
  to_float(false, am_b, b);
  adjusted_mantissa theor = to_extended_halfway(b);
  bigint theor_digits(theor.mantissa);
  int32_t theor_exp = theor.power2;

  // scale real digits and theor digits to be same power.
  int32_t pow2_exp = theor_exp - real_exp;
  uint32_t pow5_exp = uint32_t(-real_exp);
  if (pow5_exp != 0) {
    FASTFLOAT_ASSERT(theor_digits.pow5(pow5_exp));
  }
  if (pow2_exp > 0) {
    FASTFLOAT_ASSERT(theor_digits.pow2(uint32_t(pow2_exp)));
  } else if (pow2_exp < 0) {
    FASTFLOAT_ASSERT(real_digits.pow2(uint32_t(-pow2_exp)));
  }

  // compare digits, and use it to director rounding
  int ord = real_digits.compare(theor_digits);
  adjusted_mantissa answer = am;
  round<T>(answer, [ord](adjusted_mantissa& a, int32_t shift) {
    round_nearest_tie_even(a, shift, [ord](bool is_odd, bool _, bool __) -> bool {
      (void)_;  // not needed, since we've done our comparison
      (void)__; // not needed, since we've done our comparison
      if (ord > 0) {
        return true;
      } else if (ord < 0) {
        return false;
      } else {
        return is_odd;
      }
    });
  });

  return answer;
}